

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  char cVar2;
  ostream *poVar3;
  istream *piVar4;
  int iVar5;
  bool bVar6;
  string program;
  string local_380;
  string line;
  Token t;
  Token local_310;
  Tokenizer tokenizer;
  ifstream file;
  
  if (argc < 2) {
    poVar3 = std::operator<<((ostream *)&std::cout,"ReqLang Interpreter");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"  Usage: reqlang file.req <flags>");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"  Flags:");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"    -v : Verbose output");
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar5 = 0;
  }
  else {
    if (((argc == 2) || (pcVar1 = argv[2], *pcVar1 != '-')) || (pcVar1[1] != 'v')) {
      bVar6 = false;
    }
    else {
      bVar6 = pcVar1[2] == '\0';
    }
    std::ifstream::ifstream(&file);
    std::ifstream::open((char *)&file,(_Ios_Openmode)argv[1]);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      poVar3 = std::operator<<((ostream *)&std::cerr,"No file found (");
      poVar3 = std::operator<<(poVar3,argv[1]);
      std::operator<<(poVar3,")");
      iVar5 = 1;
    }
    else {
      program._M_dataplus._M_p = (pointer)&program.field_2;
      program._M_string_length = 0;
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      program.field_2._M_local_buf[0] = '\0';
      line.field_2._M_local_buf[0] = '\0';
      while( true ) {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&file,(string *)&line);
        if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tokenizer,&line,"\n");
        std::__cxx11::string::append((string *)&program);
        std::__cxx11::string::~string((string *)&tokenizer);
      }
      std::__cxx11::string::pop_back();
      if (bVar6) {
        poVar3 = std::operator<<((ostream *)&std::cout,"[TOK] Starting");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      std::__cxx11::string::string((string *)&local_380,(string *)&program);
      Tokenizer::Tokenizer(&tokenizer,&local_380);
      std::__cxx11::string::~string((string *)&local_380);
      t.type = Empty;
      t.value.
      super__Variant_base<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
      .super__Move_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      super__Copy_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      super__Move_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      super__Copy_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      super__Variant_storage_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>._M_u.
      _M_first._M_storage = (_Uninitialized<int,_true>)0;
      t.value.
      super__Variant_base<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
      .super__Move_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      super__Copy_assign_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      super__Move_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      super__Copy_ctor_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      super__Variant_storage_alias<int,_double,_std::__cxx11::basic_string<char>,_bool,_char>.
      _M_index = '\0';
      do {
        Tokenizer::getNextToken(&local_310,&tokenizer);
        Token::operator=(&t,&local_310);
        std::__detail::__variant::
        _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
        ::~_Variant_storage((_Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                             *)&local_310.value);
        poVar3 = operator<<((ostream *)&std::cout,&t);
        std::endl<char,std::char_traits<char>>(poVar3);
      } while (t.type != Eof);
      std::__detail::__variant::
      _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
      ::~_Variant_storage((_Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                           *)&t.value);
      Tokenizer::~Tokenizer(&tokenizer);
      std::__cxx11::string::~string((string *)&line);
      std::__cxx11::string::~string((string *)&program);
      iVar5 = 0;
    }
    std::ifstream::~ifstream(&file);
  }
  return iVar5;
}

Assistant:

int main(int argc, char *argv[]) {
    if (argc < 2) {
        cout << "ReqLang Interpreter" << endl
             << "  Usage: reqlang file.req <flags>" << endl
             << "  Flags:" << endl
             << "    -v : Verbose output" << endl;
        return 0;
    }

    bool verbose = argc > 2 && strcmp(argv[2], "-v") == 0;

    ifstream file;
    file.open(argv[1]);
    if (!file.is_open()) {
        cerr << "No file found (" << argv[1] << ")";
        return 1;
    }

    string program;
    string line;
    while (getline(file, line)) {
        program += line + "\n";
    }
    program.pop_back();

    if (verbose) cout << "[TOK] Starting" << endl;

    Tokenizer tokenizer = Tokenizer(program);
    Token t;
    do {
        t = tokenizer.getNextToken();
        cout << t << endl;
    } while (t.type != Eof);

    return 0;
}